

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall pbrt::syntactic::MappedFile::MappedFile(MappedFile *this,string *fn)

{
  uint8_t *ptr;
  size_t count;
  char *pcVar1;
  string *in_RSI;
  string *in_RDI;
  string *in_stack_00000068;
  FileMapping *in_stack_00000070;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  FileMapping::FileMapping(in_stack_00000070,in_stack_00000068);
  ptr = FileMapping::data((FileMapping *)(in_RDI + 0x20));
  count = FileMapping::nbytes((FileMapping *)(in_RDI + 0x20));
  BasicStringView<char>::BasicStringView((BasicStringView<char> *)(in_RDI + 0x38),(char *)ptr,count)
  ;
  pcVar1 = BasicStringView<char>::cbegin((BasicStringView<char> *)(in_RDI + 0x38));
  *(char **)(in_RDI + 0x48) = pcVar1;
  return;
}

Assistant:

MappedFile(const std::string &fn)
        : name_(fn)
        , file_(fn)
        , data_(reinterpret_cast<const char*>(file_.data()), file_.nbytes())
        , pos_(data_.cbegin())
      {
      }